

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O3

amqp_bytes_t sasl_response(amqp_pool_t *pool,amqp_sasl_method_enum method,__va_list_tag *args)

{
  uint uVar1;
  amqp_bytes_t aVar2;
  void *pvVar3;
  size_t __n;
  size_t amount;
  size_t sVar4;
  ulong uVar5;
  char *__s;
  undefined1 *__dest;
  undefined8 *puVar6;
  char *__s_00;
  amqp_bytes_t response;
  amqp_bytes_t local_40;
  
  if (method == AMQP_SASL_METHOD_EXTERNAL) {
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar6 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar6 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 1;
    }
    __s = (char *)*puVar6;
    amount = strlen(__s);
    amqp_pool_alloc_bytes(pool,amount,&local_40);
    __dest = (undefined1 *)local_40.bytes;
    if ((undefined1 *)local_40.bytes == (undefined1 *)0x0) goto LAB_00104628;
  }
  else {
    if (method != AMQP_SASL_METHOD_PLAIN) {
      amqp_abort("Invalid SASL method: %d");
    }
    uVar1 = args->gp_offset;
    uVar5 = (ulong)uVar1;
    if (uVar5 < 0x29) {
      args->gp_offset = (uint)(uVar5 + 8);
      __s_00 = *(char **)((long)args->reg_save_area + uVar5);
      __n = strlen(__s_00);
      if (0x20 < uVar1) goto LAB_001045b9;
      puVar6 = (undefined8 *)(uVar5 + 8 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 0x10;
    }
    else {
      puVar6 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 1;
      __s_00 = (char *)*puVar6;
      __n = strlen(__s_00);
LAB_001045b9:
      puVar6 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 1;
    }
    __s = (char *)*puVar6;
    amount = strlen(__s);
    sVar4 = strlen(__s_00);
    amqp_pool_alloc_bytes(pool,sVar4 + amount + 2,&local_40);
    pvVar3 = local_40.bytes;
    if ((undefined1 *)local_40.bytes == (undefined1 *)0x0) goto LAB_00104628;
    *(undefined1 *)local_40.bytes = 0;
    memcpy((undefined1 *)((long)local_40.bytes + 1),__s_00,__n);
    *(undefined1 *)((long)pvVar3 + __n + 1) = 0;
    __dest = (undefined1 *)((long)pvVar3 + __n + 2);
  }
  memcpy(__dest,__s,amount);
LAB_00104628:
  aVar2.bytes = local_40.bytes;
  aVar2.len = local_40.len;
  return aVar2;
}

Assistant:

static amqp_bytes_t sasl_response(amqp_pool_t *pool,
                                  amqp_sasl_method_enum method, va_list args) {
  amqp_bytes_t response;

  switch (method) {
    case AMQP_SASL_METHOD_PLAIN: {
      char *username = va_arg(args, char *);
      size_t username_len = strlen(username);
      char *password = va_arg(args, char *);
      size_t password_len = strlen(password);
      char *response_buf;

      amqp_pool_alloc_bytes(pool, strlen(username) + strlen(password) + 2,
                            &response);
      if (response.bytes == NULL)
      /* We never request a zero-length block, because of the +2
         above, so a NULL here really is ENOMEM. */
      {
        return response;
      }

      response_buf = response.bytes;
      response_buf[0] = 0;
      memcpy(response_buf + 1, username, username_len);
      response_buf[username_len + 1] = 0;
      memcpy(response_buf + username_len + 2, password, password_len);
      break;
    }
    case AMQP_SASL_METHOD_EXTERNAL: {
      char *identity = va_arg(args, char *);
      size_t identity_len = strlen(identity);

      amqp_pool_alloc_bytes(pool, identity_len, &response);
      if (response.bytes == NULL) {
        return response;
      }

      memcpy(response.bytes, identity, identity_len);
      break;
    }
    default:
      amqp_abort("Invalid SASL method: %d", (int)method);
  }

  return response;
}